

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall
LLVMBC::ModuleParseContext::parse_function_record(ModuleParseContext *this,BlockOrRecord *entry)

{
  pointer *pppVVar1;
  pointer *pppFVar2;
  ulong *puVar3;
  pointer ppTVar4;
  ulong uVar5;
  pointer puVar6;
  unsigned_long uVar7;
  pointer pvVar8;
  iterator __position;
  iterator __position_00;
  TypeID TVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  FunctionType *this_00;
  Function *this_01;
  ulong uVar12;
  FunctionType *this_02;
  bool bVar13;
  Function *func;
  FunctionType *func_type;
  size_type id;
  Function *local_1058;
  FunctionType *local_1050;
  Function *local_1048;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
  local_1040;
  unsigned_long local_1028;
  undefined5 uStack_1020;
  undefined3 uStack_101b;
  undefined5 uStack_1018;
  undefined3 uStack_1013;
  undefined2 uStack_1010;
  undefined3 local_100e;
  undefined3 uStack_100b;
  undefined2 uStack_1008;
  char acStack_1006 [4062];
  
  if (this->use_strtab == true) {
    p_Var10 = ::dxil_spv::get_thread_log_callback();
    if (p_Var10 == (LoggingCallback)0x0) {
      parse_function_record();
    }
    else {
      uStack_1008 = 0x7320;
      builtin_strncpy(acStack_1006,"trtab.\n",8);
      uStack_1018 = 0x322065646f;
      uStack_1013 = 0x687720;
      uStack_1010 = 0x6369;
      local_100e = 0x752068;
      uStack_100b = 0x736573;
      local_1028._0_1_ = 'U';
      local_1028._1_1_ = 'n';
      local_1028._2_1_ = 'k';
      local_1028._3_1_ = 'n';
      local_1028._4_1_ = 'o';
      local_1028._5_1_ = 'w';
      local_1028._6_1_ = 'n';
      local_1028._7_1_ = ' ';
      uStack_1020 = 0x6c75646f6d;
      uStack_101b = 0x632065;
      pvVar11 = ::dxil_spv::get_thread_log_callback_userdata();
      (*p_Var10)(pvVar11,Error,(char *)&local_1028);
    }
  }
  else {
    puVar3 = (entry->ops).
             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (0x10 < (ulong)((long)(entry->ops).
                             super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
      ppTVar4 = (this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*puVar3 < (ulong)((long)(this->types).
                                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3))
      {
        this_02 = (FunctionType *)ppTVar4[*puVar3];
      }
      else {
        this_02 = (FunctionType *)0x0;
      }
      if (this_02 != (FunctionType *)0x0) {
        uVar5 = puVar3[2];
        TVar9 = Type::getTypeID(&this_02->super_Type);
        local_1050 = (FunctionType *)0x0;
        if (TVar9 == FunctionTyID) {
          local_1050 = this_02;
        }
        this_00 = local_1050;
        if (local_1050 != (FunctionType *)0x0) {
LAB_00188ea7:
          local_1050 = this_00;
          bVar13 = local_1050 != (FunctionType *)0x0;
          if (!bVar13) {
            return bVar13;
          }
          local_1028 = (long)(this->values).
                             super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->values).
                             super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
          this_01 = LLVMContext::
                    construct<LLVMBC::Function,LLVMBC::FunctionType*&,unsigned_long&,LLVMBC::Module&>
                              (this->context,&local_1050,&local_1028,this->module);
          puVar6 = (entry->ops).
                   super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1058 = this_01;
          if ((0x20 < (ulong)((long)(entry->ops).
                                    super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6)) &&
             (uVar7 = puVar6[4], uVar7 != 0)) {
            uVar12 = uVar7 - 1;
            pvVar8 = (this->attribute_lists).
                     super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (uVar12 < (ulong)(((long)(this->attribute_lists).
                                        super__Vector_base<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_dxil_spv::ThreadLocalAllocator<std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >>
                                 3) * -0x5555555555555555)) {
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
              ::vector(&local_1040,pvVar8 + uVar12);
              Function::set_attributes(this_01,&local_1040);
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>
              ::~vector(&local_1040);
            }
          }
          local_1048 = local_1058;
          __position._M_current =
               (this->values).
               super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->values).
              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
            _M_realloc_insert<LLVMBC::Value*>
                      ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)
                       &this->values,__position,(Value **)&local_1048);
          }
          else {
            *__position._M_current = (Value *)local_1058;
            pppVVar1 = &(this->values).
                        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppVVar1 = *pppVVar1 + 1;
          }
          if (uVar5 != 0) {
            return bVar13;
          }
          __position_00._M_current =
               (this->functions_with_bodies).
               super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current !=
              (this->functions_with_bodies).
              super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            *__position_00._M_current = local_1058;
            pppFVar2 = &(this->functions_with_bodies).
                        super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppFVar2 = *pppFVar2 + 1;
            return bVar13;
          }
          std::vector<LLVMBC::Function*,dxil_spv::ThreadLocalAllocator<LLVMBC::Function*>>::
          _M_realloc_insert<LLVMBC::Function*const&>
                    ((vector<LLVMBC::Function*,dxil_spv::ThreadLocalAllocator<LLVMBC::Function*>> *)
                     &this->functions_with_bodies,__position_00,&local_1058);
          return bVar13;
        }
        TVar9 = Type::getTypeID(&this_02->super_Type);
        if (TVar9 == PointerTyID) {
          this_00 = (FunctionType *)PointerType::getElementType((PointerType *)this_02);
          TVar9 = Type::getTypeID((Type *)this_00);
          if (TVar9 == FunctionTyID) goto LAB_00188ea7;
          p_Var10 = ::dxil_spv::get_thread_log_callback();
          if (p_Var10 == (LoggingCallback)0x0) {
            parse_function_record();
            std::terminate();
          }
        }
        else {
          p_Var10 = ::dxil_spv::get_thread_log_callback();
          if (p_Var10 == (LoggingCallback)0x0) {
            parse_function_record();
            std::terminate();
          }
        }
        uStack_1018 = 0x6163206e69;
        uStack_1013 = 0x3c7473;
        uStack_1010 = 0x3e54;
        local_100e = 0xa2e;
        local_1028._0_1_ = 'I';
        local_1028._1_1_ = 'n';
        local_1028._2_1_ = 'v';
        local_1028._3_1_ = 'a';
        local_1028._4_1_ = 'l';
        local_1028._5_1_ = 'i';
        local_1028._6_1_ = 'd';
        local_1028._7_1_ = ' ';
        uStack_1020 = 0x2065707974;
        uStack_101b = 0x204449;
        pvVar11 = ::dxil_spv::get_thread_log_callback_userdata();
        (*p_Var10)(pvVar11,Error,(char *)&local_1028);
        std::terminate();
      }
    }
  }
  return false;
}

Assistant:

bool ModuleParseContext::parse_function_record(const BlockOrRecord &entry)
{
	if (use_strtab)
	{
		LOGE("Unknown module code 2 which uses strtab.\n");
		return false;
	}

	if (entry.ops.size() < 3)
		return false;

	auto *type = get_type(entry.ops[0]);
	if (!type)
		return false;

	// Calling convention is [1], not relevant.
	bool is_proto = entry.ops[2];
	// Lots of other irrelevant arguments ...

	auto *func_type = dyn_cast<FunctionType>(type);
	if (!func_type)
		func_type = cast<FunctionType>(cast<PointerType>(type)->getElementType());

	if (!func_type)
		return false;

	auto id = values.size();
	auto *func = context->construct<Function>(func_type, id, *module);

	if (entry.ops.size() >= 5 && entry.ops[4] != 0 && (entry.ops[4] - 1) < attribute_lists.size())
		func->set_attributes(attribute_lists[entry.ops[4] - 1]);

	values.push_back(func);

	if (!is_proto)
		functions_with_bodies.push_back(func);

	return true;
}